

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_input_motion(nk_context *ctx,int x,int y)

{
  nk_vec2 nVar1;
  nk_vec2 nVar2;
  nk_vec2 nVar3;
  
  if (ctx != (nk_context *)0x0) {
    nVar2.x = (float)x;
    nVar2.y = (float)y;
    (ctx->input).mouse.pos = nVar2;
    nVar1 = (ctx->input).mouse.prev;
    nVar3.x = nVar2.x - nVar1.x;
    nVar3.y = nVar2.y - nVar1.y;
    (ctx->input).mouse.delta = nVar3;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x369d,"void nk_input_motion(struct nk_context *, int, int)");
}

Assistant:

NK_API void
nk_input_motion(struct nk_context *ctx, int x, int y)
{
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    in->mouse.pos.x = (float)x;
    in->mouse.pos.y = (float)y;
    in->mouse.delta.x = in->mouse.pos.x - in->mouse.prev.x;
    in->mouse.delta.y = in->mouse.pos.y - in->mouse.prev.y;
}